

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.h
# Opt level: O3

bool __thiscall leveldb::Version::RecordReadSample(Version *this,Slice internal_key)

{
  int iVar1;
  bool bVar2;
  size_t n;
  ulong uVar3;
  Slice user_key;
  State state;
  FileMetaData *local_28;
  int local_20;
  int local_18;
  
  uVar3 = internal_key.size_;
  user_key.data_ = internal_key.data_;
  if ((7 < uVar3) && ((user_key.data_[uVar3 - 8] & 0xfeU) == 0)) {
    local_18 = 0;
    user_key.size_ = uVar3 - 8;
    ForEachOverlapping(this,user_key,internal_key,&local_28,
                       RecordReadSample(leveldb::Slice)::State::Match(void*,int,leveldb::
                       FileMetaData__);
    if ((local_18 < 2) ||
       (((local_28 == (FileMetaData *)0x0 ||
         (iVar1 = local_28->allowed_seeks, local_28->allowed_seeks = iVar1 + -1, 1 < iVar1)) ||
        (this->file_to_compact_ != (FileMetaData *)0x0)))) {
      bVar2 = false;
    }
    else {
      this->file_to_compact_ = local_28;
      this->file_to_compact_level_ = local_20;
      bVar2 = true;
    }
    return bVar2;
  }
  return false;
}

Assistant:

inline bool ParseInternalKey(const Slice& internal_key,
                             ParsedInternalKey* result) {
  const size_t n = internal_key.size();
  if (n < 8) return false;
  uint64_t num = DecodeFixed64(internal_key.data() + n - 8);
  unsigned char c = num & 0xff;
  result->sequence = num >> 8;
  result->type = static_cast<ValueType>(c);
  result->user_key = Slice(internal_key.data(), n - 8);
  return (c <= static_cast<unsigned char>(kTypeValue));
}